

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

void __thiscall
basisu::vector<unsigned_char>::reserve(vector<unsigned_char> *this,size_t new_capacity_size_t)

{
  uchar *__ptr;
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  vector<unsigned_char> local_28;
  
  if (new_capacity_size_t >> 0x20 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x1e3,"void basisu::vector<unsigned char>::reserve(size_t) [T = unsigned char]");
  }
  uVar3 = (uint)new_capacity_size_t;
  if (this->m_capacity < uVar3) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this,uVar3,false,1,(object_mover)0x0,false);
    return;
  }
  if (uVar3 < this->m_capacity) {
    local_28.m_p = (uchar *)0x0;
    local_28.m_size = 0;
    local_28.m_capacity = 0;
    if (uVar3 < this->m_size) {
      uVar3 = this->m_size;
    }
    elemental_vector::increase_capacity
              ((elemental_vector *)&local_28,uVar3,false,1,(object_mover)0x0,false);
    if (&local_28 == this) {
      uVar2 = this->m_size;
      uVar1 = local_28.m_size;
    }
    else {
      uVar3 = this->m_size;
      if (local_28.m_capacity < uVar3) {
        if (local_28.m_p != (uchar *)0x0) {
          free(local_28.m_p);
          local_28.m_p = (uchar *)0x0;
          local_28.m_size = 0;
          local_28.m_capacity = 0;
          uVar3 = this->m_size;
        }
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_28,uVar3,false,1,(object_mover)0x0,false);
      }
      else if (local_28.m_size != 0) {
        local_28._8_8_ = (ulong)local_28.m_capacity << 0x20;
      }
      if ((local_28.m_p != (uchar *)0x0) && (this->m_p != (uchar *)0x0)) {
        memcpy(local_28.m_p,this->m_p,(ulong)this->m_size);
      }
      uVar2 = this->m_size;
      uVar1 = uVar2;
    }
    __ptr = this->m_p;
    this->m_p = local_28.m_p;
    this->m_size = uVar1;
    uVar1 = this->m_capacity;
    this->m_capacity = local_28.m_capacity;
    local_28.m_capacity = uVar1;
    local_28.m_size = uVar2;
    if (__ptr != (uchar *)0x0) {
      local_28.m_p = __ptr;
      free(__ptr);
    }
  }
  return;
}

Assistant:

inline void reserve(size_t new_capacity_size_t)
      {
         if (new_capacity_size_t > UINT32_MAX)
         {
            assert(0);
            return;
         }

         uint32_t new_capacity = (uint32_t)new_capacity_size_t;

         if (new_capacity > m_capacity)
            increase_capacity(new_capacity, false);
         else if (new_capacity < m_capacity)
         {
            // Must work around the lack of a "decrease_capacity()" method.
            // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
            vector tmp;
            tmp.increase_capacity(helpers::maximum(m_size, new_capacity), false);
            tmp = *this;
            swap(tmp);
         }
      }